

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

string * __thiscall
helics::ActionMessage::packetize_abi_cxx11_(string *__return_storage_ptr__,ActionMessage *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  packetize(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ActionMessage::packetize() const
{
    std::string data;
    packetize(data);
    return data;
}